

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilePOSIX.cpp
# Opt level: O0

void __thiscall adios2::transport::FilePOSIX::WaitForOpen(FilePOSIX *this)

{
  bool bVar1;
  int iVar2;
  char *in_RDI;
  string *in_stack_00000088;
  FilePOSIX *in_stack_00000090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_48 [8];
  future<int> *in_stack_ffffffffffffffc0;
  string local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  if ((in_RDI[0xf9] & 1U) != 0) {
    bVar1 = std::__basic_future<int>::valid((__basic_future<int> *)0xd77111);
    if (bVar1) {
      iVar2 = std::future<int>::get(in_stack_ffffffffffffffc0);
      *(int *)(in_RDI + 0xf0) = iVar2;
    }
    in_RDI[0xf9] = '\0';
    std::operator+(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    std::operator+(in_stack_ffffffffffffffa8,in_RDI);
    CheckFile(in_stack_00000090,in_stack_00000088);
    std::__cxx11::string::~string(local_28);
    std::__cxx11::string::~string(local_48);
    in_RDI[0x6c] = '\x01';
  }
  return;
}

Assistant:

void FilePOSIX::WaitForOpen()
{
    if (m_IsOpening)
    {
        if (m_OpenFuture.valid())
        {
            m_FileDescriptor = m_OpenFuture.get();
        }
        m_IsOpening = false;
        CheckFile("couldn't open file " + m_Name + ", in call to POSIX open");
        m_IsOpen = true;
    }
}